

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

int loader_impl_destroy_exec_path_map_cb_iterate
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  if (val != (set_value)0x0) {
    vector_destroy(val);
  }
  return 0;
}

Assistant:

int loader_impl_destroy_exec_path_map_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;
	(void)key;
	(void)args;

	if (val != NULL)
	{
		vector paths = val;

		vector_destroy(paths);
	}

	return 0;
}